

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.cpp
# Opt level: O0

int add_to_database_so(Map *symbol_file_map,string_view file_path)

{
  _Alloc_hider *p_Var1;
  bool bVar2;
  _Ios_Openmode _Var3;
  char *pcVar4;
  istream *piVar5;
  long lVar6;
  mapped_type *pmVar7;
  undefined1 *puVar8;
  allocator<char> local_2c9;
  key_type local_2c8;
  mapped_type *local_2a8;
  mapped_type *entry;
  char *symbol_pos;
  basic_string_view<char,_std::char_traits<char>_> local_288;
  long local_278;
  size_type rinit;
  long local_268;
  size_type linit;
  string line;
  allocator<char> local_229;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string_view local_1e8;
  string local_1d8;
  stringstream local_1b8 [8];
  stringstream ss;
  int local_2c;
  int symbols;
  Map *symbol_file_map_local;
  string_view file_path_local;
  
  file_path_local._M_len = (size_t)file_path._M_str;
  symbol_file_map_local = (Map *)file_path._M_len;
  local_2c = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"objdump -TCw ",&local_229);
  pcVar4 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
           data((basic_string_view<char,_std::char_traits<char>_> *)&symbol_file_map_local);
  std::operator+(&local_208,&local_228,pcVar4);
  std::experimental::fundamentals_v1::basic_string_view<char,std::char_traits<char>>::
  basic_string_view<std::allocator<char>>
            ((basic_string_view<char,std::char_traits<char>> *)&local_1e8,&local_208);
  get_output_from_command_abi_cxx11_(&local_1d8,local_1e8);
  _Var3 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_1d8,_Var3);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  std::__cxx11::string::string((string *)&linit);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_1b8,(string *)&linit);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_1b8,(string *)&linit);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_1b8,(string *)&linit);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_1b8,(string *)&linit);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_1b8,(string *)&linit);
  local_268 = std::__cxx11::string::find((char *)&linit,0x17965f);
  if (local_268 == -1) {
    file_path_local._M_str._4_4_ = 0;
  }
  else {
    local_278 = std::__cxx11::string::rfind((char *)&linit,0x17965f);
    if (local_278 == -1) {
      file_path_local._M_str._4_4_ = 0;
    }
    else {
      while( true ) {
        piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_1b8,(string *)&linit);
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
        if (!bVar2) break;
        lVar6 = std::__cxx11::string::data();
        std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
        basic_string_view(&local_288,(char *)(lVar6 + local_268),5);
        std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
        basic_string_view((basic_string_view<char,_std::char_traits<char>_> *)&symbol_pos,"*UND*");
        bVar2 = std::experimental::fundamentals_v1::operator==(local_288,_symbol_pos);
        if (!bVar2) {
          lVar6 = std::__cxx11::string::data();
          entry = (mapped_type *)(lVar6 + local_278 + -3);
          do {
            puVar8 = &entry->field_0x1;
            p_Var1 = &entry->_M_dataplus;
            entry = (mapped_type *)puVar8;
          } while (*p_Var1 != (_Alloc_hider)0x20);
          for (; pmVar7 = entry, entry->_M_dataplus == (_Alloc_hider)0x20;
              entry = (mapped_type *)&entry->field_0x1) {
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2c8,(char *)pmVar7,&local_2c9);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](symbol_file_map,&local_2c8);
          std::__cxx11::string::~string((string *)&local_2c8);
          std::allocator<char>::~allocator(&local_2c9);
          local_2a8 = pmVar7;
          std::__cxx11::string::push_back((char)pmVar7);
          pcVar4 = std::experimental::fundamentals_v1::
                   basic_string_view<char,_std::char_traits<char>_>::data
                             ((basic_string_view<char,_std::char_traits<char>_> *)
                              &symbol_file_map_local);
          std::__cxx11::string::operator+=((string *)local_2a8,pcVar4);
          local_2c = local_2c + 1;
        }
      }
      file_path_local._M_str._4_4_ = local_2c;
    }
  }
  rinit._4_4_ = 1;
  std::__cxx11::string::~string((string *)&linit);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return file_path_local._M_str._4_4_;
}

Assistant:

int add_to_database_so(Map &symbol_file_map, const string_view file_path) {
	int symbols = 0;
	std::stringstream ss(get_output_from_command(std::string("objdump -TCw ") + file_path.data()));
	std::string line;
	std::getline(ss, line); //empty line
	std::getline(ss, line); //file format
	std::getline(ss, line); //empty line
	std::getline(ss, line); //caption
	std::getline(ss, line); //.init line
	auto linit = line.find(".init");
	if (linit == std::string::npos) {
		return symbols;
	}
	auto rinit = line.rfind(".init");
	if (rinit == std::string::npos) {
		return symbols;
	}
	while (std::getline(ss, line)) {
		if (string_view(line.data() + linit, 5) == "*UND*") {
			continue;
		}
		auto symbol_pos = line.data() + rinit - 3;
		while (*symbol_pos++ != ' ') {
		}
		while (*symbol_pos == ' ') {
			symbol_pos++;
		}
		auto &entry = symbol_file_map[symbol_pos];
		entry.push_back(file_separator);
		entry += file_path.data();
		symbols++;
	}
	return symbols;
}